

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::detail::
do_assert_result_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,
          olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *db,
          key_type key,value_view expected,char *file,int line)

{
  __extent_storage<18446744073709551615UL> message;
  value_view expected_00;
  ostringstream local_1f0 [8];
  ostringstream msg;
  undefined1 local_78 [8];
  get_result result;
  Message local_48;
  AssertHelper local_40;
  ScopedTrace local_31 [8];
  ScopedTrace trace;
  
  std::__cxx11::ostringstream::ostringstream(local_1f0);
  unodb::detail::dump_key<unsigned_long>((ostream *)local_1f0,(unsigned_long)db);
  std::__cxx11::stringbuf::str();
  message._M_extent_value = (size_t)local_78;
  testing::ScopedTrace::ScopedTrace
            (local_31,(char *)expected._M_extent._M_extent_value._M_extent_value,(int)file,
             (string *)message._M_extent_value);
  std::__cxx11::string::~string((string *)local_78);
  olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::get
            ((get_result *)local_78,
             (olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
             (unsigned_long)db);
  if (result.super__Optional_base<unodb::qsbr_ptr_span<const_std::byte>,_false,_false>._M_payload.
      super__Optional_payload<unodb::qsbr_ptr_span<const_std::byte>,_true,_false,_false>.
      super__Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>._M_payload.field2[8] ==
      '\0') {
    std::operator<<((ostream *)&std::cerr,"db.get did not find ");
    unodb::detail::dump_key<unsigned_long>((ostream *)&std::cerr,(unsigned_long)db);
    std::operator<<((ostream *)&std::cerr,'\n');
    olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::dump
              ((olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)this,
               (ostream *)&std::cerr);
    testing::Message::Message(&local_48);
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
               ,0x80,"Failed");
    testing::internal::AssertHelper::operator=(&local_40,&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_48.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  else {
    expected_00._M_extent._M_extent_value = message._M_extent_value;
    expected_00._M_ptr = expected._M_ptr;
    assert_value_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
              ((detail *)local_78,(get_result *)key,expected_00);
  }
  std::_Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_>::_M_reset
            ((_Optional_payload_base<unodb::qsbr_ptr_span<const_std::byte>_> *)local_78);
  testing::ScopedTrace::~ScopedTrace(local_31);
  std::__cxx11::ostringstream::~ostringstream(local_1f0);
  return;
}

Assistant:

void do_assert_result_eq(const Db &db, typename Db::key_type key,
                         unodb::value_view expected, const char *file,
                         int line) {
  std::ostringstream msg;
  unodb::detail::dump_key(msg, key);
  const testing::ScopedTrace trace(file, line, msg.str());
  const auto result = db.get(key);
  if (!Db::key_found(result)) {
    // LCOV_EXCL_START
    std::cerr << "db.get did not find ";
    unodb::detail::dump_key(std::cerr, key);
    std::cerr << '\n';
    db.dump(std::cerr);
    FAIL();
    // LCOV_EXCL_STOP
  }
  assert_value_eq<Db>(result, expected);
}